

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageGetPixel(gdImagePtr im,int x,int y)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((im->cy1 <= y) && (y <= im->cy2)) && (im->cx1 <= x)) && (x <= im->cx2)) {
    if (im->trueColor != 0) {
      return im->tpixels[y][x];
    }
    uVar1 = (uint)im->pixels[y][x];
  }
  return uVar1;
}

Assistant:

BGD_DECLARE(int) gdImageGetPixel (gdImagePtr im, int x, int y)
{
	if (gdImageBoundsSafeMacro (im, x, y)) {
		if (im->trueColor) {
			return im->tpixels[y][x];
		} else {
			return im->pixels[y][x];
		}
	} else {
		return 0;
	}
}